

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O3

err_t bign96ParamsStd(bign_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  err_t eVar3;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar3 = 0x6d;
  }
  else {
    iVar2 = strCmp(name,"1.2.112.0.2.0.34.101.45.3.0");
    eVar3 = 0xca;
    if (iVar2 == 0) {
      params->l = 0x60;
      memCopy(params->p,_curve96v1_p,0x18);
      memCopy(params->a,_curve96v1_a,0x18);
      memCopy(params->seed,_curve96v1_seed,8);
      memCopy(params->b,_curve96v1_b,0x18);
      memCopy(params->q,_curve96v1_q,0x18);
      memCopy(params->yG,_curve96v1_yG,0x18);
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

err_t bign96ParamsStd(bign_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (strEq(name, _curve96v1_name))
	{
		params->l = 96;
		memCopy(params->p, _curve96v1_p, 24);
		memCopy(params->a, _curve96v1_a, 24);
		memCopy(params->seed, _curve96v1_seed, 8);
		memCopy(params->b, _curve96v1_b, 24);
		memCopy(params->q, _curve96v1_q, 24);
		memCopy(params->yG, _curve96v1_yG, 24);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}